

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

void __thiscall asmjit::JitRuntime::JitRuntime(JitRuntime *this)

{
  HostRuntime::HostRuntime(&this->super_HostRuntime);
  (this->super_HostRuntime).super_Runtime._vptr_Runtime = (_func_int **)&PTR__JitRuntime_0019ac10;
  VMemMgr::VMemMgr(&this->_memMgr);
  return;
}

Assistant:

JitRuntime::JitRuntime() noexcept {}